

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferWriteTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BasicBufferDataCase::BasicBufferDataCase
          (BasicBufferDataCase *this,Context *context,char *name,char *desc,deUint32 target,
          deUint32 usage,int size,VerifyType verify)

{
  deqp::gls::BufferTestUtil::BufferCase::BufferCase
            (&this->super_BufferCase,context->m_testCtx,context->m_renderCtx,name,desc);
  (this->super_BufferCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BufferCase_01e3ae58;
  this->m_target = target;
  this->m_usage = usage;
  this->m_size = size;
  this->m_verify = verify;
  return;
}

Assistant:

BasicBufferDataCase (Context& context, const char* name, const char* desc, deUint32 target, deUint32 usage, int size, VerifyType verify)
		: BufferCase	(context.getTestContext(), context.getRenderContext(), name, desc)
		, m_target		(target)
		, m_usage		(usage)
		, m_size		(size)
		, m_verify		(verify)
	{
	}